

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptNativeIntArray::SetItem(JavascriptNativeIntArray *this,uint32 index,int32 iValue)

{
  if (iValue == -0x7fffe) {
    ToVarArray(this);
    JavascriptArray::DirectSetItemAt<void*>((JavascriptArray *)this,index,&DAT_10000fff80002);
  }
  else {
    JavascriptArray::DirectSetItemAt<int>((JavascriptArray *)this,index,iValue);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeIntArray::SetItem(uint32 index, int32 iValue)
    {
        if (iValue == JavascriptNativeIntArray::MissingItem)
        {
            JavascriptArray *varArr = JavascriptNativeIntArray::ToVarArray(this);
            varArr->DirectSetItemAt(index, JavascriptNumber::ToVar(iValue, GetScriptContext()));
            return TRUE;
        }

        this->DirectSetItemAt(index, iValue);
        return TRUE;
    }